

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

Opnd * __thiscall IR::ListOpnd::CloneUseInternal(ListOpnd *this,Func *func)

{
  uint count;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd **opnds;
  ListOpndType *this_00;
  Opnd *this_01;
  RegOpnd *pRVar4;
  ListOpnd *pLVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x963,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  count = this->count;
  uVar6 = 0;
  opnds = Memory::AllocateArray<Memory::JitArenaAllocator,IR::RegOpnd*,false>
                    ((Memory *)func->m_alloc,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0
                     ,(long)(int)count);
  uVar7 = 0;
  if (0 < (int)count) {
    uVar7 = (ulong)count;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    this_00 = Item(this,(int)uVar6);
    this_01 = Opnd::CloneUse(&this_00->super_Opnd,func);
    pRVar4 = Opnd::AsRegOpnd(this_01);
    opnds[uVar6] = pRVar4;
  }
  pLVar5 = New(func,opnds,count);
  Memory::DeleteArray<Memory::JitArenaAllocator,IR::RegOpnd*>(func->m_alloc,(long)(int)count,opnds);
  return &pLVar5->super_Opnd;
}

Assistant:

Opnd * ListOpnd::CloneUseInternal(Func * func)
{
    Assert(m_kind == OpndKindList);
    int count = Count();
    ListOpndType** opnds = JitAnewArray(func->m_alloc, ListOpndType*, count);
    for (int i = 0; i < count; ++i)
    {
        ListOpndType* newOpnd = Item(i)->CloneUse(func)->AsRegOpnd();
        opnds[i] = newOpnd;
    }
    ListOpnd* newList = ListOpnd::New(func, opnds, count);
    JitAdeleteArray(func->m_alloc, count, opnds);
    return newList;
}